

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLin>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  short sVar2;
  ImU32 IVar3;
  uint uVar4;
  GetterXsYs<short> *pGVar5;
  TransformerLogLin *pTVar6;
  ImPlotPlot *pIVar7;
  ImDrawVert *pIVar8;
  uint *puVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  double dVar12;
  ImPlotContext *pIVar13;
  int iVar14;
  long lVar15;
  double dVar16;
  ImVec2 IVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pIVar13 = GImPlot;
  pGVar5 = this->Getter;
  pTVar6 = this->Transformer;
  iVar14 = pGVar5->Count;
  lVar15 = (long)(((pGVar5->Offset + prim + 1) % iVar14 + iVar14) % iVar14) * (long)pGVar5->Stride;
  sVar2 = *(short *)((long)pGVar5->Ys + lVar15);
  dVar16 = log10((double)(int)*(short *)((long)pGVar5->Xs + lVar15) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar7 = pIVar13->CurrentPlot;
  dVar12 = (pIVar7->XAxis).Range.Min;
  iVar14 = pTVar6->YAxis;
  IVar1 = pIVar13->PixelRange[iVar14].Min;
  IVar17.x = (float)(pIVar13->Mx *
                     (((double)(float)(dVar16 / pIVar13->LogDenX) *
                       ((pIVar7->XAxis).Range.Max - dVar12) + dVar12) - dVar12) + (double)IVar1.x);
  IVar17.y = (float)(pIVar13->My[iVar14] * ((double)(int)sVar2 - pIVar7->YAxis[iVar14].Range.Min) +
                    (double)IVar1.y);
  fVar18 = (this->P1).x;
  fVar19 = (this->P1).y;
  auVar21._0_4_ = ~-(uint)(IVar17.x <= fVar18) & (uint)IVar17.x;
  auVar21._4_4_ = ~-(uint)(IVar17.y <= fVar19) & (uint)IVar17.y;
  auVar21._8_4_ = ~-(uint)(fVar18 < IVar17.x) & (uint)IVar17.x;
  auVar21._12_4_ = ~-(uint)(fVar19 < IVar17.y) & (uint)IVar17.y;
  auVar10._4_4_ = (uint)fVar19 & -(uint)(IVar17.y <= fVar19);
  auVar10._0_4_ = (uint)fVar18 & -(uint)(IVar17.x <= fVar18);
  auVar10._8_4_ = (uint)fVar18 & -(uint)(fVar18 < IVar17.x);
  auVar10._12_4_ = (uint)fVar19 & -(uint)(fVar19 < IVar17.y);
  auVar21 = auVar21 | auVar10;
  fVar20 = (cull_rect->Min).y;
  auVar11._4_8_ = auVar21._8_8_;
  auVar11._0_4_ = -(uint)(auVar21._4_4_ < fVar20);
  auVar22._0_8_ = auVar11._0_8_ << 0x20;
  auVar22._8_4_ = -(uint)(auVar21._8_4_ < (cull_rect->Max).x);
  auVar22._12_4_ = -(uint)(auVar21._12_4_ < (cull_rect->Max).y);
  auVar23._4_4_ = -(uint)(fVar20 < auVar21._4_4_);
  auVar23._0_4_ = -(uint)((cull_rect->Min).x < auVar21._0_4_);
  auVar23._8_8_ = auVar22._8_8_;
  iVar14 = movmskps((int)pIVar7,auVar23);
  if (iVar14 == 0xf) {
    fVar20 = fVar19 + this->HalfWeight;
    fVar19 = fVar19 - this->HalfWeight;
    IVar3 = this->Col;
    IVar1 = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    (pIVar8->pos).x = fVar18;
    (pIVar8->pos).y = fVar20;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = IVar3;
    pIVar8[1].pos.x = IVar17.x;
    pIVar8[1].pos.y = fVar19;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = IVar3;
    pIVar8[2].pos.x = fVar18;
    pIVar8[2].pos.y = fVar19;
    pIVar8[2].uv = IVar1;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = IVar3;
    pIVar8[3].pos.x = IVar17.x;
    pIVar8[3].pos.y = fVar20;
    pIVar8[3].uv = IVar1;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = IVar3;
    DrawList->_VtxWritePtr = pIVar8 + 4;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar9 = DrawList->_IdxWritePtr;
    *puVar9 = uVar4;
    puVar9[1] = uVar4 + 1;
    puVar9[2] = DrawList->_VtxCurrentIdx + 2;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar9[3] = uVar4;
    puVar9[4] = uVar4 + 1;
    puVar9[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar9 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar19 = IVar17.x - this->HalfWeight;
    fVar18 = this->HalfWeight + IVar17.x;
    fVar20 = (this->P1).y;
    IVar3 = this->Col;
    IVar1 = *uv;
    pIVar8[4].pos.x = fVar19;
    pIVar8[4].pos.y = IVar17.y;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = IVar3;
    pIVar8[1].pos.x = fVar18;
    pIVar8[1].pos.y = fVar20;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = IVar3;
    pIVar8[2].pos.x = fVar19;
    pIVar8[2].pos.y = fVar20;
    pIVar8[2].uv = IVar1;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = IVar3;
    pIVar8[3].pos.x = fVar18;
    pIVar8[3].pos.y = IVar17.y;
    pIVar8[3].uv = IVar1;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = IVar3;
    DrawList->_VtxWritePtr = pIVar8 + 4;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar9 = DrawList->_IdxWritePtr;
    *puVar9 = uVar4;
    puVar9[1] = uVar4 + 1;
    puVar9[2] = DrawList->_VtxCurrentIdx + 2;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar9[3] = uVar4;
    puVar9[4] = uVar4 + 1;
    puVar9[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar9 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  this->P1 = IVar17;
  return (char)iVar14 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }